

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  char_t *s;
  char_t *pcVar4;
  char_t *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char cVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  
  pcVar5 = value + -1;
  do {
    pcVar4 = pcVar5;
    bVar2 = pcVar4[1];
    pcVar5 = pcVar4 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
  uVar7 = (ulong)((bVar2 - 0x2b & 0xfd) == 0);
  pcVar6 = pcVar5 + uVar7;
  if ((pcVar5[uVar7] == '0') && ((pcVar4[uVar7 + 2] & 0xdfU) == 0x58)) {
    pcVar6 = pcVar5 + uVar7 + 2;
    do {
      cVar8 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar8 == '0');
    uVar7 = 0;
    uVar3 = 0;
    do {
      uVar9 = (int)cVar8 - 0x30;
      if (uVar9 < 10) {
        uVar3 = uVar3 << 4 | uVar9;
      }
      else {
        uVar9 = (int)cVar8 | 0x20;
        if (5 < uVar9 - 0x61) goto LAB_0012269a;
        uVar3 = (uVar3 * 0x10 + uVar9) - 0x57;
      }
      cVar8 = *pcVar6;
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  do {
    cVar8 = *pcVar6;
    pcVar6 = pcVar6 + 1;
  } while (cVar8 == '0');
  uVar7 = 0;
  uVar3 = 0;
  cVar10 = cVar8;
  while ((int)cVar10 - 0x30U < 10) {
    uVar3 = ((int)cVar10 - 0x30U) + uVar3 * 10;
    pcVar1 = pcVar6 + uVar7;
    uVar7 = uVar7 + 1;
    cVar10 = *pcVar1;
  }
  if (9 < uVar7) {
    bVar11 = true;
    if (uVar7 != 10) goto LAB_001226b1;
    if ('3' < cVar8) {
      bVar11 = -1 < (int)uVar3 || cVar8 != '4';
      goto LAB_001226b1;
    }
  }
  bVar11 = false;
LAB_001226b1:
  if (bVar2 == 0x2d) {
    uVar9 = -uVar3;
    if (-minv < uVar3) {
      uVar9 = minv;
    }
    if (bVar11) {
      uVar9 = minv;
    }
    return uVar9;
  }
  if (maxv <= uVar3) {
    uVar3 = maxv;
  }
  if (bVar11) {
    uVar3 = maxv;
  }
  return uVar3;
LAB_0012269a:
  bVar11 = 8 < uVar7;
  goto LAB_001226b1;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}